

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ktx::CommandCreate::scaleImage
          (CommandCreate *this,unique_ptr<Image,_std::default_delete<Image>_> *image,
          ktx_uint32_t width,ktx_uint32_t height)

{
  long *plVar1;
  long *plVar2;
  undefined4 in_register_00000014;
  long *plVar3;
  undefined4 in_R8D;
  long *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  plVar3 = (long *)CONCAT44(in_register_00000014,width);
  plVar1 = (long *)*plVar3;
  std::optional<std::__cxx11::string>::value_or<std::__cxx11::string&>
            (&local_50,(optional<std::__cxx11::string> *)(image + 0x1e),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(image + 0x23));
  (**(code **)(*plVar1 + 0x88))
            (*(undefined4 *)
              &image[(ulong)(*(byte *)((long)&image[0x27]._M_t.
                                              super___uniq_ptr_impl<Image,_std::default_delete<Image>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>
                                              .super__Head_base<0UL,_Image_*,_false>._M_head_impl +
                                      4) ^ 1) + 0x27]._M_t.
               super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl,&local_58,plVar1,height,in_R8D,
             local_50._M_dataplus._M_p,
             *(undefined4 *)
              ((long)&image[(ulong)(*(byte *)&image[0x29]._M_t.
                                              super___uniq_ptr_impl<Image,_std::default_delete<Image>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>
                                              .super__Head_base<0UL,_Image_*,_false>._M_head_impl ^
                                   1) + 0x28]._M_t.
                      super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
                      super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                      super__Head_base<0UL,_Image_*,_false>._M_head_impl + 4));
  plVar2 = local_58;
  local_58 = (long *)0x0;
  plVar1 = (long *)*plVar3;
  *plVar3 = (long)plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
  }
  local_58 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Command)._vptr_Command = (_func_int **)*plVar3;
  *plVar3 = 0;
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Image>
CommandCreate::scaleImage(std::unique_ptr<Image> image, ktx_uint32_t width, ktx_uint32_t height)
{
    try {
        image = image->resample(width, height,
                options.mipmapFilter.value_or(options.defaultMipmapFilter).c_str(),
                options.mipmapFilterScale.value_or(options.defaultMipmapFilterScale),
                options.mipmapWrap.value_or(options.defaultMipmapWrap));
    } catch (const std::exception& e) {
        fatal(rc::RUNTIME_ERROR, "Image resampling failed: {}", e.what());
    }
    return image;
}